

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitContNew(FunctionValidator *this,ContNew *curr)

{
  bool bVar1;
  Module *pMVar2;
  bool local_41;
  bool local_31;
  HeapType local_30;
  HeapType local_28;
  BasicType local_1c;
  ContNew *local_18;
  ContNew *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ContNew *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  local_31 = true;
  if (pMVar2 != (Module *)0x0) {
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    local_31 = FeatureSet::hasStackSwitching(&pMVar2->features);
  }
  shouldBeTrue<wasm::ContNew*>
            (this,local_31,local_18,"cont.new requires stack-switching [--enable-stack-switching]");
  local_1c = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)90>).
                      super_Expression.type,&local_1c);
  if (!bVar1) {
    bVar1 = wasm::Type::isNonNullable
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)90>).
                        super_Expression.type);
    bVar1 = shouldBeTrue<wasm::ContNew*>
                      (this,bVar1,local_18,"cont.new should have a non-nullable reference type");
    if (bVar1) {
      bVar1 = wasm::Type::isContinuation
                        (&(local_18->super_SpecificExpression<(wasm::Expression::Id)90>).
                          super_Expression.type);
      local_41 = false;
      if (bVar1) {
        local_30 = wasm::Type::getHeapType
                             (&(local_18->super_SpecificExpression<(wasm::Expression::Id)90>).
                               super_Expression.type);
        local_28.id = (uintptr_t)HeapType::getContinuation(&local_30);
        local_41 = HeapType::isSignature(&local_28);
      }
      shouldBeTrue<wasm::ContNew*>
                (this,local_41,local_18,"cont.new must be annotated with a continuation type");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitContNew(ContNew* curr) {
  // TODO implement actual type-checking
  shouldBeTrue(!getModule() || getModule()->features.hasStackSwitching(),
               curr,
               "cont.new requires stack-switching [--enable-stack-switching]");

  if (curr->type == Type::unreachable) {
    return;
  }

  if (!shouldBeTrue(curr->type.isNonNullable(),
                    curr,
                    "cont.new should have a non-nullable reference type")) {
    return;
  }

  shouldBeTrue(curr->type.isContinuation() &&
                 curr->type.getHeapType().getContinuation().type.isSignature(),
               curr,
               "cont.new must be annotated with a continuation type");
}